

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

bool anon_unknown.dwarf_1c2de7::checkPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int lx,int rx,int ly,int ry,
               int width)

{
  ostream *poVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  
  bVar3 = true;
  if (ly <= ry) {
    bVar3 = false;
    lVar7 = (long)ly;
    do {
      if (lx <= rx) {
        lVar5 = (long)lx;
        do {
          if ((ulong)sampleCount->_data[sampleCount->_sizeY * lVar7 + lVar5] != 0) {
            iVar6 = ((int)lVar5 + (int)lVar7 * width) % 0x801;
            fVar8 = (float)iVar6;
            uVar4 = 0;
            do {
              if ((ph->_data[ph->_sizeY * lVar7 + lVar5][uVar4] != fVar8) ||
                 (NAN(ph->_data[ph->_sizeY * lVar7 + lVar5][uVar4]) || NAN(fVar8))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
                poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,", sample ",9);
                poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
                poVar1 = std::ostream::_M_insert<double>
                                   ((double)ph->_data[lVar7 * ph->_sizeY + lVar5][uVar4]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,", should be ",0xc);
                plVar2 = (long *)std::ostream::operator<<(poVar1,iVar6);
                std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
                std::ostream::put((char)plVar2);
                std::ostream::flush();
                std::ostream::flush();
                return bVar3;
              }
              uVar4 = uVar4 + 1;
            } while (sampleCount->_data[sampleCount->_sizeY * lVar7 + lVar5] != uVar4);
          }
          lVar5 = lVar5 + 1;
        } while (rx + 1 != (int)lVar5);
      }
      lVar5 = lVar7 + 1;
      bVar3 = ry <= lVar7;
      lVar7 = lVar5;
    } while (ry + 1 != (int)lVar5);
  }
  return bVar3;
}

Assistant:

bool
checkPixels (Array2D<unsigned int>& sampleCount,
             Array2D<T*> &ph,
             int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T>(((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i << ": " << ph[y][x][i]
                         << ", should be " << (y * width + x) % 2049 << endl << flush;
                    return false;
                }
            }
        }
    }

    return true;
}